

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O0

err_t beltMAC(octet *mac,void *src,size_t count,octet *key,size_t len)

{
  bool_t bVar1;
  blob_t state_00;
  octet *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  octet *in_R8;
  void *state;
  size_t in_stack_ffffffffffffffc8;
  
  if ((((in_R8 == (octet *)0x10) || (in_R8 == (octet *)0x18)) || (in_R8 == (octet *)0x20)) &&
     (((bVar1 = memIsValid(in_RSI,(size_t)in_RDX), bVar1 != 0 &&
       (bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RDI,8), bVar1 != 0)))) {
    beltMAC_keep();
    state_00 = blobCreate(in_stack_ffffffffffffffc8);
    if (state_00 == (blob_t)0x0) {
      return 0x6e;
    }
    beltMACStart(in_RDX,in_RCX,(size_t)in_R8);
    beltMACStepA(in_RDX,(size_t)in_RCX,in_R8);
    beltMACStepG(in_R8,state_00);
    blobClose((blob_t)0x15d00a);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltMAC(octet mac[8], const void* src, size_t count,
	const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(mac, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// выработать имитовставку
	beltMACStart(state, key, len);
	beltMACStepA(src, count, state);
	beltMACStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}